

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.h
# Opt level: O2

QByteArray * __thiscall
QCborStreamReader::readAllUtf8String(QByteArray *__return_storage_ptr__,QCborStreamReader *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar1 = _readAndAppendToUtf8String_helper(this,__return_storage_ptr__);
  if (!bVar1) {
    local_38.d = (__return_storage_ptr__->d).d;
    local_38.ptr = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    local_38.size = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = 0;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray readAllUtf8String()
    {
        QByteArray dst;
        if (!readAndAppendToUtf8String(dst))
            dst = QByteArray{};
        return dst;
    }